

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderEditor.cpp
# Opt level: O0

void __thiscall OrderEditor::addActionsToToolbar(OrderEditor *this,Actions *actions)

{
  QAction *pQVar1;
  reference ppQVar2;
  QList<QAction_*> local_38;
  QAction *local_20;
  QAction *head;
  Actions *actions_local;
  OrderEditor *this_local;
  
  head = (QAction *)actions;
  actions_local = (Actions *)this;
  QWidget::actions();
  ppQVar2 = QList<QAction_*>::operator[](&local_38,0);
  pQVar1 = *ppQVar2;
  QList<QAction_*>::~QList(&local_38);
  local_20 = pQVar1;
  QWidget::insertAction((QAction *)this->mToolbar,pQVar1);
  QWidget::insertAction((QAction *)this->mToolbar,local_20);
  QWidget::insertAction((QAction *)this->mToolbar,local_20);
  QToolBar::insertSeparator((QAction *)this->mToolbar);
  QWidget::insertAction((QAction *)this->mToolbar,local_20);
  QWidget::insertAction((QAction *)this->mToolbar,local_20);
  QToolBar::insertSeparator((QAction *)this->mToolbar);
  return;
}

Assistant:

void OrderEditor::addActionsToToolbar(Actions const& actions) {
    auto head = mToolbar->actions()[0];
    mToolbar->insertAction(head, actions.add);
    mToolbar->insertAction(head, actions.remove);
    mToolbar->insertAction(head, actions.duplicate);
    mToolbar->insertSeparator(head);
    mToolbar->insertAction(head, actions.moveUp);
    mToolbar->insertAction(head, actions.moveDown);
    mToolbar->insertSeparator(head);
}